

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarmath_p.h
# Opt level: O0

R_conflict20 QRomanCalendrical::dayInYearToYmd(int dayInYear)

{
  long lVar1;
  int iVar2;
  R_conflict16 RVar3;
  int in_EDI;
  long in_FS_OFFSET;
  R_conflict20 RVar4;
  R_conflict16 yearMonth;
  R_conflict16 month5Day;
  int in_stack_ffffffffffffffb4;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RVar3 = QRoundingDown::qDivMod<153U,_int,_true>(in_EDI * 5 + 2);
  local_20 = RVar3.quotient;
  RVar3 = QRoundingDown::qDivMod<12U,_int,_true>(local_20 + 2);
  local_28 = RVar3.quotient;
  uStack_24 = RVar3.remainder;
  iVar2 = QRoundingDown::qDiv<5u,int>(in_stack_ffffffffffffffb4);
  RVar4.month = uStack_24 + 1;
  RVar4.year = local_28;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    RVar4.day = iVar2 + 1;
    return RVar4;
  }
  __stack_chk_fail();
}

Assistant:

constexpr auto dayInYearToYmd(int dayInYear)
{
    // The year is an adjustment to the year for which dayInYear may be denormal.
    struct R { int year; int month; int day; };
    // Shared code for Julian and Milankovic (at least).
    using namespace QRoundingDown;
    const auto month5Day = qDivMod<FiveMonths>(5 * dayInYear + 2);
    // Its remainder changes by 5 per day, except at roughly monthly quotient steps.
    const auto yearMonth = qDivMod<12>(month5Day.quotient + 2);
    return R { yearMonth.quotient, yearMonth.remainder + 1, qDiv<5>(month5Day.remainder) + 1 };
}